

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knucleotide.cc
# Opt level: O0

void Calculate<1ul>(Data *input,size_t begin,HashTable<1UL> *table)

{
  uchar *puVar1;
  MappedReference<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>_> puVar2;
  size_type sVar3;
  unsigned_long *puVar4;
  uint local_4c;
  unsigned_long uStack_48;
  uint i;
  unsigned_long local_40;
  size_t nsize;
  uchar *itr_end;
  uchar *itr_begin;
  raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<1ul>,unsigned_int>,Key<1ul>::Hash,phmap::EqualTo<Key<1ul>>,std::allocator<std::pair<Key<1ul>const,unsigned_int>>>
  *prStack_20;
  Key<1UL> key;
  HashTable<1UL> *table_local;
  size_t begin_local;
  Data *input_local;
  
  prStack_20 = (raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<1ul>,unsigned_int>,Key<1ul>::Hash,phmap::EqualTo<Key<1ul>>,std::allocator<std::pair<Key<1ul>const,unsigned_int>>>
                *)table;
  Key<1UL>::Key((Key<1UL> *)((long)&itr_begin + 4));
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(input);
  Key<1UL>::InitKey((Key<1UL> *)((long)&itr_begin + 4),puVar1 + begin);
  puVar2 = phmap::priv::
           raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<1ul>,unsigned_int>,Key<1ul>::Hash,phmap::EqualTo<Key<1ul>>,std::allocator<std::pair<Key<1ul>const,unsigned_int>>>
           ::operator[]<Key<1ul>,phmap::priv::FlatHashMapPolicy<Key<1ul>,unsigned_int>>
                     (prStack_20,(key_arg<Key<1UL>_> *)((long)&itr_begin + 4));
  *puVar2 = *puVar2 + 1;
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(input);
  itr_end = puVar1 + begin + 4;
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(input);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(input);
  nsize = (size_t)(puVar1 + sVar3);
  uStack_48 = 1;
  puVar4 = std::min<unsigned_long>(&stack0xffffffffffffffb8,&thread_count);
  local_40 = *puVar4;
  for (; itr_end < nsize; itr_end = itr_end + 4) {
    for (local_4c = 0; local_4c < local_40; local_4c = local_4c + 1) {
      Key<1UL>::UpdateKey((Key<1UL> *)((long)&itr_begin + 4),itr_end[local_4c]);
    }
    Key<1UL>::MaskKey((Key<1UL> *)((long)&itr_begin + 4));
    puVar2 = phmap::priv::
             raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<1ul>,unsigned_int>,Key<1ul>::Hash,phmap::EqualTo<Key<1ul>>,std::allocator<std::pair<Key<1ul>const,unsigned_int>>>
             ::operator[]<Key<1ul>,phmap::priv::FlatHashMapPolicy<Key<1ul>,unsigned_int>>
                       (prStack_20,(key_arg<Key<1UL>_> *)((long)&itr_begin + 4));
    *puVar2 = *puVar2 + 1;
  }
  return;
}

Assistant:

void Calculate(const Cfg::Data& input, size_t begin, HashTable<size>& table)
{
    // original implementation fully recomputes the hash key for each
    // insert to the hash table. This implementation only partially
    // updates the hash, this is the same with C GCC, Rust #6 and Rust #4
    Key<size> key;
    // initialize key
    key.InitKey(input.data() + begin);
    // use key to increment value
    ++table[key];

    auto itr_begin = input.data() + begin + thread_count;
    auto itr_end = (input.data() + input.size() + 1) - size;
    size_t nsize = std::min(size, thread_count);
    for(;itr_begin < itr_end; itr_begin += thread_count) {
        // update the key 1 byte at a time
        for(unsigned i = 0; i < nsize; ++i)
            key.UpdateKey( itr_begin[i] );

        // then finally mask out excess information
        key.MaskKey();

        // then use key to increment value
        ++table[key];
    }
}